

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O2

void Omega_h::inertia::recursively_bisect
               (CommPtr *comm,Real tolerance,Reals *p_coords,Reals *p_masses,Remotes *p_owners,
               Rib *p_hints)

{
  const_iterator __position;
  Comm *this;
  Vector<3> axis_00;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  I32 IVar2;
  int iVar3;
  Write<signed_char> local_1e8;
  undefined1 local_1d8 [32];
  Vector<3> axis;
  Write<double> local_190;
  Write<double> local_180;
  Write<signed_char> local_170;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_160;
  Write<double> local_150;
  Write<double> local_140;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_130;
  Write<double> local_120;
  Write<double> local_110;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_f0;
  Remotes local_e0;
  Dist dist;
  
  IVar2 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (IVar2 != 1) {
    local_1e8.shared_alloc_.alloc = (Alloc *)0x0;
    local_1e8.shared_alloc_.direct_ptr = (void *)0x0;
    __position._M_current =
         (p_hints->axes).
         super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (__position._M_current ==
        (p_hints->axes).super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_100,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
      Write<double>::Write(&local_110,&p_coords->write_);
      Write<double>::Write(&local_120,&p_masses->write_);
      mark_bisection((inertia *)&dist,(CommPtr *)&local_100,(Reals *)&local_110,(Reals *)&local_120,
                     tolerance,&axis);
      Write<signed_char>::operator=(&local_1e8,(Write<signed_char> *)&dist);
      Write<signed_char>::~Write((Write<signed_char> *)&dist);
      Write<double>::~Write(&local_120);
      Write<double>::~Write(&local_110);
      p_Var1 = &local_100;
    }
    else {
      axis.super_Few<double,_3>.array_[2] =
           ((__position._M_current)->super_Few<double,_3>).array_[2];
      axis.super_Few<double,_3>.array_[0] =
           ((__position._M_current)->super_Few<double,_3>).array_[0];
      axis.super_Few<double,_3>.array_[1] =
           ((__position._M_current)->super_Few<double,_3>).array_[1];
      std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::erase
                (&p_hints->axes,__position);
      std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_130,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
      Write<double>::Write(&local_140,&p_coords->write_);
      Write<double>::Write(&local_150,&p_masses->write_);
      axis_00.super_Few<double,_3>.array_[1] = axis.super_Few<double,_3>.array_[1];
      axis_00.super_Few<double,_3>.array_[0] = axis.super_Few<double,_3>.array_[0];
      axis_00.super_Few<double,_3>.array_[2] = axis.super_Few<double,_3>.array_[2];
      mark_bisection_given_axis
                (&dist.parent_comm_,(Reals *)&local_130,(Reals *)&local_140,tolerance,axis_00);
      Write<signed_char>::operator=(&local_1e8,(Write<signed_char> *)&dist);
      Write<signed_char>::~Write((Write<signed_char> *)&dist);
      Write<double>::~Write(&local_150);
      Write<double>::~Write(&local_140);
      p_Var1 = &local_130;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_160,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    Write<signed_char>::Write(&local_170,&local_1e8);
    bi_partition(&dist,(CommPtr *)&local_160,(Read<signed_char> *)&local_170);
    Write<signed_char>::~Write(&local_170);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
    Write<double>::Write(&local_180,&p_coords->write_);
    Dist::exch<double>((Dist *)local_1d8,(Read<double> *)&dist,(Int)&local_180);
    Write<double>::operator=(&p_coords->write_,(Write<signed_char> *)local_1d8);
    Write<double>::~Write((Write<double> *)local_1d8);
    Write<double>::~Write(&local_180);
    Write<double>::Write(&local_190,&p_masses->write_);
    Dist::exch<double>((Dist *)local_1d8,(Read<double> *)&dist,(Int)&local_190);
    Write<double>::operator=(&p_masses->write_,(Write<signed_char> *)local_1d8);
    Write<double>::~Write((Write<double> *)local_1d8);
    Write<double>::~Write(&local_190);
    Remotes::Remotes(&local_e0,p_owners);
    Dist::exch((Remotes *)local_1d8,&dist,&local_e0,1);
    Remotes::operator=(p_owners,(Remotes *)local_1d8);
    Remotes::~Remotes((Remotes *)local_1d8);
    Remotes::~Remotes(&local_e0);
    IVar2 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    iVar3 = divide_no_remainder<int>(IVar2,2);
    this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    IVar2 = Comm::rank(this);
    Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    Comm::split((Comm *)local_1d8,(I32)this,IVar2 / iVar3);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)local_1d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f0,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    recursively_bisect((CommPtr *)&local_f0,tolerance,p_coords,p_masses,p_owners,p_hints);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::insert
              (&p_hints->axes,
               (p_hints->axes).
               super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
               super__Vector_impl_data._M_start,&axis);
    Dist::~Dist(&dist);
    Write<signed_char>::~Write(&local_1e8);
  }
  return;
}

Assistant:

void recursively_bisect(CommPtr comm, Real tolerance, Reals* p_coords,
    Reals* p_masses, Remotes* p_owners, Rib* p_hints) {
  auto& coords = *p_coords;
  auto& masses = *p_masses;
  auto& owners = *p_owners;
  auto& hints = *p_hints;
  if (comm->size() == 1) {
    return;
  }
  Vector<3> axis;
  Read<I8> marks;
  if (hints.axes.empty()) {
    marks = inertia::mark_bisection(comm, coords, masses, tolerance, axis);
  } else {
    axis = hints.axes.front();
    hints.axes.erase(hints.axes.begin());
    marks = inertia::mark_bisection_given_axis(
        comm, coords, masses, tolerance, axis);
  }
  auto dist = bi_partition(comm, marks);
  coords = dist.exch(coords, 3);
  masses = dist.exch(masses, 1);
  owners = dist.exch(owners, 1);
  auto halfsize = divide_no_remainder(comm->size(), 2);
  comm = comm->split(comm->rank() / halfsize, comm->rank() % halfsize);
  recursively_bisect(comm, tolerance, p_coords, p_masses, p_owners, p_hints);
  hints.axes.insert(hints.axes.begin(), axis);
}